

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mingw_make.cpp
# Opt level: O2

ProString * __thiscall
MingwMakefileGenerator::fixLibFlag
          (ProString *__return_storage_ptr__,MingwMakefileGenerator *this,ProString *lib)

{
  bool bVar1;
  qsizetype qVar2;
  Data *pDVar3;
  QArrayDataPointer<char16_t> *this_00;
  QStringBuilder<QLatin1String,_ProString> *__return_storage_ptr___00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_108;
  QArrayDataPointer<char16_t> local_f0;
  undefined1 local_d8 [48];
  undefined1 local_a8 [32];
  Data *local_88;
  QStringBuilder<QLatin1String,_ProString> local_78;
  long local_38;
  
  this_00 = &QStack_108;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ProString::startsWith(lib,"-l",CaseSensitive);
  if (bVar1) {
    qVar2 = QtPrivate::lengthHelperPointer<char>("-l");
    __return_storage_ptr___00 = (QStringBuilder<QLatin1String,_ProString> *)local_d8;
    ProString::mid((ProString *)__return_storage_ptr___00,lib,2,-1);
    MakefileGenerator::escapeFilePath
              ((ProString *)local_a8,(MakefileGenerator *)this,
               (ProString *)__return_storage_ptr___00);
    local_78.a.m_data = "-l";
    local_78.a.m_size = qVar2;
    ProString::ProString(&local_78.b,(ProString *)local_a8);
    ProString::ProString<QLatin1String,ProString>(__return_storage_ptr__,&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78.b);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
  }
  else {
    bVar1 = ProString::startsWith(lib,"-L",CaseSensitive);
    if (bVar1) {
      pDVar3 = (Data *)QtPrivate::lengthHelperPointer<char>("-L");
      ProString::mid((ProString *)&local_78,lib,2,-1);
      ProString::toQString((QString *)&QStack_108,(ProString *)&local_78);
      Option::fixPathToTargetOS((QString *)&local_f0,(QString *)&QStack_108,false,true);
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0xc])((QArrayDataPointer<char16_t> *)local_d8,this,&local_f0);
      local_88 = (Data *)local_d8._16_8_;
      local_a8._24_8_ = local_d8._8_8_;
      local_a8._16_8_ = local_d8._0_8_;
      local_a8._8_8_ = "-L";
      local_d8._0_8_ = (Data *)0x0;
      local_d8._8_8_ = (char16_t *)0x0;
      local_d8._16_8_ = (Data *)0x0;
      local_a8._0_8_ = pDVar3;
      ProString::ProString<QLatin1String,QString>
                (__return_storage_ptr__,(QStringBuilder<QLatin1String,_QString> *)local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(local_a8 + 0x10));
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
    }
    else {
      bVar1 = ProString::startsWith(lib,"lib",CaseSensitive);
      if (!bVar1) {
        __return_storage_ptr___00 = (QStringBuilder<QLatin1String,_ProString> *)local_d8;
        ProString::toQString((QString *)__return_storage_ptr___00,lib);
        Option::fixPathToTargetOS
                  ((QString *)local_a8,(QString *)__return_storage_ptr___00,false,true);
        (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
          _vptr_QMakeSourceFileInfo[0xc])(&local_78,this,(QArrayDataPointer<char16_t> *)local_a8);
        ProString::ProString(__return_storage_ptr__,(QString *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a8);
        goto LAB_0019a8db;
      }
      pDVar3 = (Data *)QtPrivate::lengthHelperPointer<char>("-l");
      ProString::mid((ProString *)&local_78,lib,3,-1);
      this_00 = &local_f0;
      ProString::toQString((QString *)this_00,(ProString *)&local_78);
      (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
        _vptr_QMakeSourceFileInfo[0xc])((QArrayDataPointer<char16_t> *)local_d8,this,this_00);
      local_88 = (Data *)local_d8._16_8_;
      local_a8._24_8_ = local_d8._8_8_;
      local_a8._16_8_ = local_d8._0_8_;
      local_a8._8_8_ = "-l";
      local_d8._0_8_ = (Data *)0x0;
      local_d8._8_8_ = (char16_t *)0x0;
      local_d8._16_8_ = (Data *)0x0;
      local_a8._0_8_ = pDVar3;
      ProString::ProString<QLatin1String,QString>
                (__return_storage_ptr__,(QStringBuilder<QLatin1String,_QString> *)local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)(local_a8 + 0x10));
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
    __return_storage_ptr___00 = &local_78;
  }
LAB_0019a8db:
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)__return_storage_ptr___00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProString MingwMakefileGenerator::fixLibFlag(const ProString &lib)
{
    if (lib.startsWith("-l"))  // Fallback for unresolved -l libs.
        return QLatin1String("-l") + escapeFilePath(lib.mid(2));
    if (lib.startsWith("-L"))  // Lib search path. Needed only by -l above.
        return QLatin1String("-L")
                + escapeFilePath(Option::fixPathToTargetOS(lib.mid(2).toQString(), false));
    if (lib.startsWith("lib"))  // Fallback for unresolved MSVC-style libs.
        return QLatin1String("-l") + escapeFilePath(lib.mid(3).toQString());
    return escapeFilePath(Option::fixPathToTargetOS(lib.toQString(), false));
}